

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

void ensure_writev_room(estate s,int add_count)

{
  void *pvVar1;
  int in_ESI;
  long in_RDI;
  internal_iovec *tmpl;
  int j;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  if ((*(int *)(in_RDI + 0x20) == 0) && (100 - in_ESI <= *(int *)(in_RDI + 0x14))) {
    pvVar1 = ffs_malloc(CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    *(int *)(in_RDI + 0x20) = in_ESI + 200;
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x14); iVar2 = iVar2 + 1) {
      *(undefined8 *)((long)pvVar1 + (long)iVar2 * 0x18 + 0x10) =
           *(undefined8 *)(*(long *)(in_RDI + 0x18) + (long)iVar2 * 0x18 + 0x10);
      *(undefined8 *)((long)pvVar1 + (long)iVar2 * 0x18) =
           *(undefined8 *)(*(long *)(in_RDI + 0x18) + (long)iVar2 * 0x18);
      *(undefined8 *)((long)pvVar1 + (long)iVar2 * 0x18 + 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x18) + (long)iVar2 * 0x18 + 8);
    }
    *(void **)(in_RDI + 0x18) = pvVar1;
    *(undefined4 *)(in_RDI + 0x10) = 0;
  }
  else if ((*(int *)(in_RDI + 0x20) != 0) &&
          (*(int *)(in_RDI + 0x20) - in_ESI <= *(int *)(in_RDI + 0x14))) {
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) << 1;
    pvVar1 = ffs_realloc((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                         in_stack_ffffffffffffffe8);
    *(void **)(in_RDI + 0x18) = pvVar1;
  }
  return;
}

Assistant:

static void
ensure_writev_room(estate s, int add_count)
{
    /* 
     * we need to track the length of the strings we're writing
     * assume a small number (STACK_ARRAY_SIZE) but expand
     * dynamically if we have more...  
     */
    if (!(s->malloc_vec_size) &&
	(s->iovcnt >= STACK_ARRAY_SIZE - add_count)) {
	int j;
	internal_iovec *tmpl = (internal_iovec *)
	    malloc(sizeof(internal_iovec) * (2 * STACK_ARRAY_SIZE + add_count));
	s->malloc_vec_size = (2 * STACK_ARRAY_SIZE + add_count);
	for (j = 0; j < s->iovcnt; j++) {
	    tmpl[j].iov_len = (s->iovec)[j].iov_len;
	    tmpl[j].iov_base = (s->iovec)[j].iov_base;
	    tmpl[j].iov_offset = (s->iovec)[j].iov_offset;
	}
	s->iovec = tmpl;
	s->iovec_is_stack = 0;
    } else if ((s->malloc_vec_size != 0) &&
	       (s->iovcnt >= s->malloc_vec_size - add_count)) {
	(s->malloc_vec_size) *= 2;
	s->iovec = realloc(s->iovec, sizeof(internal_iovec) *
				(s->malloc_vec_size));
    }
}